

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlquerymodel.cpp
# Opt level: O0

QVariant * __thiscall
QSqlQueryModel::headerData(QSqlQueryModel *this,int section,Orientation orientation,int role)

{
  bool bVar1;
  int iVar2;
  QSqlQueryModelPrivate *i;
  int in_ECX;
  int in_EDX;
  int *in_RSI;
  QVariant *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  QSqlQueryModelPrivate *d;
  QVariant val;
  QVariant *in_stack_ffffffffffffff38;
  QVariant *this_00;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined1 local_80 [28];
  undefined4 local_64;
  int local_4c;
  QVariant local_48;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  local_4c = in_R8D;
  i = d_func((QSqlQueryModel *)0x15008f);
  if (in_ECX == 1) {
    local_28.shared = (PrivateShared *)0xaaaaaaaaaaaaaaaa;
    local_28._8_8_ = 0xaaaaaaaaaaaaaaaa;
    local_28._16_8_ = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    QList<QHash<int,_QVariant>_>::value
              ((QList<QHash<int,_QVariant>_> *)CONCAT44(in_EDX,1),(qsizetype)i);
    QHash<int,_QVariant>::value
              ((QHash<int,_QVariant> *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)
               ,in_RSI);
    QHash<int,_QVariant>::~QHash((QHash<int,_QVariant> *)in_RDI);
    if ((local_4c == 0) && (bVar1 = QVariant::isValid(in_RDI), !bVar1)) {
      QList<QHash<int,_QVariant>_>::value
                ((QList<QHash<int,_QVariant>_> *)CONCAT44(in_EDX,in_ECX),(qsizetype)i);
      local_64 = 2;
      QHash<int,_QVariant>::value
                ((QHash<int,_QVariant> *)
                 CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),in_RSI);
      QVariant::operator=(this_00,in_RDI);
      QVariant::~QVariant(&local_48);
      QHash<int,_QVariant>::~QHash((QHash<int,_QVariant> *)in_RDI);
    }
    bVar1 = QVariant::isValid(in_RDI);
    if (bVar1) {
      QVariant::QVariant(in_stack_ffffffffffffff38,(QVariant *)0x1501ba);
      iVar2 = 1;
    }
    else if (((local_4c == 0) && (iVar2 = QSqlRecord::count((QSqlRecord *)0x1501dc), in_EDX < iVar2)
             ) && (iVar2 = QSqlQueryModelPrivate::columnInQuery
                                     ((QSqlQueryModelPrivate *)
                                      CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                                      (int)((ulong)in_RSI >> 0x20)), iVar2 != -1)) {
      QSqlRecord::fieldName
                ((QSqlRecord *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                 (int)((ulong)in_RSI >> 0x20));
      QVariant::QVariant(in_RDI,(QString *)local_80);
      QString::~QString((QString *)0x150228);
      iVar2 = 1;
    }
    else {
      iVar2 = 0;
    }
    QVariant::~QVariant((QVariant *)&local_28);
    if (iVar2 != 0) goto LAB_00150271;
  }
  QAbstractItemModel::headerData((int)in_RDI,(Orientation)in_RSI,in_EDX);
LAB_00150271:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return this_00;
}

Assistant:

QVariant QSqlQueryModel::headerData(int section, Qt::Orientation orientation, int role) const
{
    Q_D(const QSqlQueryModel);
    if (orientation == Qt::Horizontal) {
        QVariant val = d->headers.value(section).value(role);
        if (role == Qt::DisplayRole && !val.isValid())
            val = d->headers.value(section).value(Qt::EditRole);
        if (val.isValid())
            return val;
        if (role == Qt::DisplayRole && d->rec.count() > section && d->columnInQuery(section) != -1)
            return d->rec.fieldName(section);
    }
    return QAbstractItemModel::headerData(section, orientation, role);
}